

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

int pre_match(c2m_ctx_t c2m_ctx,int c,pos_t *pos,node_code_t *node_code,node_t_conflict *node)

{
  stream_t psVar1;
  short *psVar2;
  undefined8 uVar3;
  node_t_conflict pnVar4;
  char *extraout_RDX;
  pos_t p;
  
  psVar1 = c2m_ctx->cs;
  if (psVar1 == (stream_t)0x0) {
    pre_match_cold_3();
  }
  else {
    if (psVar1->f == (FILE *)0x0) {
      return 0;
    }
    if (psVar1->getc_func == (_func_int_c2m_ctx_t *)0x0) goto LAB_00193b00;
    psVar2 = *(short **)(psVar1->getc_func + (long)psVar1->f * 8 + -8);
    if (*psVar2 != c) {
      return 0;
    }
    if (pos != (pos_t *)0x0) {
      uVar3 = *(undefined8 *)(psVar2 + 8);
      pos->fname = *(char **)(psVar2 + 4);
      pos->lno = (int)uVar3;
      pos->ln_pos = (int)((ulong)uVar3 >> 0x20);
    }
    if (node_code != (node_code_t *)0x0) {
      *node_code = *(node_code_t *)(psVar2 + 0xc);
    }
    if (node != (node_t_conflict *)0x0) {
      *node = *(node_t_conflict *)(psVar2 + 0x10);
    }
    psVar1 = c2m_ctx->cs;
    if (((psVar1 != (stream_t)0x0) && (psVar1->getc_func != (_func_int_c2m_ctx_t *)0x0)) &&
       (node_code = (node_code_t *)psVar1->f, (FILE *)node_code != (FILE *)0x0)) {
      psVar1->f = (FILE *)(((FILE *)((long)node_code + -0xd8))->_unused2 + 0x13);
      return 1;
    }
  }
  pre_match_cold_1();
LAB_00193b00:
  pre_match_cold_2();
  pnVar4 = new_node(c2m_ctx,c);
  op_append(c2m_ctx,pnVar4,(node_t_conflict)node);
  p._8_8_ = node_code;
  p.fname = extraout_RDX;
  pnVar4 = add_pos(c2m_ctx,pnVar4,p);
  return (int)pnVar4;
}

Assistant:

static int pre_match (c2m_ctx_t c2m_ctx, int c, pos_t *pos, node_code_t *node_code, node_t *node) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  token_t t;

  if (VARR_LENGTH (token_t, pre_expr) == 0) return FALSE;
  t = VARR_LAST (token_t, pre_expr);
  if (t->code != c) return FALSE;
  if (pos != NULL) *pos = t->pos;
  if (node_code != NULL) *node_code = t->node_code;
  if (node != NULL) *node = t->node;
  VARR_POP (token_t, pre_expr);
  return TRUE;
}